

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::AndroidEnergyConsumer::operator==
          (AndroidEnergyConsumer *this,AndroidEnergyConsumer *other)

{
  __type_conflict4 _Var1;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if (((_Var1) && (this->energy_consumer_id_ == other->energy_consumer_id_)) &&
     (this->ordinal_ == other->ordinal_)) {
    _Var1 = ::std::operator==(&this->type_,&other->type_);
    if (_Var1) {
      _Var1 = ::std::operator==(&this->name_,&other->name_);
      return _Var1;
    }
  }
  return false;
}

Assistant:

bool AndroidEnergyConsumer::operator==(const AndroidEnergyConsumer& other) const {
  return unknown_fields_ == other.unknown_fields_
   && energy_consumer_id_ == other.energy_consumer_id_
   && ordinal_ == other.ordinal_
   && type_ == other.type_
   && name_ == other.name_;
}